

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentStringProperty
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *lhs,string *rhs)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  undefined4 *local_48;
  long local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  
  __n = lhs->_M_string_length;
  if (__n == rhs->_M_string_length) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,__n);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  local_48 = &local_38;
  if (bVar3 == false) {
    local_38 = 0x736e7528;
    local_40 = 7;
    uStack_34 = 0x297465;
  }
  else {
    pcVar1 = (lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,pcVar1 + __n);
  }
  __return_storage_ptr__->first = bVar3;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->second,local_48,local_40 + (long)local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentStringProperty(const std::string& lhs,
                                                      const std::string& rhs)
{
  const bool b = lhs == rhs;
  return std::make_pair(b, b ? lhs : valueAsString(nullptr));
}